

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StateWriter.cpp
# Opt level: O2

EStatusCode __thiscall StateWriter::Finish(StateWriter *this)

{
  EStatusCode EVar1;
  LongFilePositionType in_RAX;
  LongFilePositionType xrefTablePosition;
  LongFilePositionType local_18;
  
  local_18 = in_RAX;
  EVar1 = ObjectsContext::WriteXrefTable(this->mObjectsContext,&local_18);
  if (EVar1 == eSuccess) {
    WriteTrailerDictionary(this);
    WriteXrefReference(this,local_18);
    WriteFinalEOF(this);
    EVar1 = OutputFile::CloseFile(&this->mOutputFile);
  }
  else {
    OutputFile::CloseFile(&this->mOutputFile);
  }
  return EVar1;
}

Assistant:

EStatusCode StateWriter::Finish()
{
	EStatusCode status;
	do
	{
		LongFilePositionType xrefTablePosition;

		status = mObjectsContext->WriteXrefTable(xrefTablePosition);
		if(status != 0)
			break;

		WriteTrailerDictionary();
		WriteXrefReference(xrefTablePosition);
		WriteFinalEOF();


	} while(false);
		
	if(PDFHummus::eSuccess == status)
		status = mOutputFile.CloseFile();
	else
		mOutputFile.CloseFile();
	return status;	
}